

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O3

void __thiscall helics::apps::Tracer::runTo(Tracer *this,Time runToTime)

{
  char cVar1;
  element_type *peVar2;
  Time currentTime;
  ostream *poVar3;
  int iteration;
  Federate *this_00;
  long lVar4;
  iteration_time iVar5;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = (char)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]
                [(long)&(peVar2->super_ValueFederate).vfManager._M_t];
  if (cVar1 != '\x01') {
    if (cVar1 != '\0') goto LAB_001e31ae;
    (*(this->super_App)._vptr_App[2])(this);
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
  captureForCurrentTime(this,(Time)0x0,0);
LAB_001e31ae:
  lVar4 = 10000000000;
  iteration = 0;
  while( true ) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (Federate *)
              ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
              (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
    if (this->allow_iteration == true) {
      iVar5 = Federate::requestTimeIterative(this_00,runToTime,ITERATE_IF_NEEDED);
      currentTime = iVar5.grantedTime.internalTimeCode;
      if (iVar5.state == NEXT_STEP) {
        iteration = 0;
      }
      captureForCurrentTime(this,currentTime,iteration);
      iteration = iteration + 1;
    }
    else {
      currentTime = Federate::requestTime(this_00,runToTime);
      captureForCurrentTime(this,currentTime,0);
    }
    if (runToTime.internalTimeCode <= currentTime.internalTimeCode) break;
    if (lVar4 <= currentTime.internalTimeCode) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"processed for time ",0x13);
      poVar3 = std::ostream::_M_insert<double>
                         ((double)(currentTime.internalTimeCode % 1000000000) * 1e-09 +
                          (double)(currentTime.internalTimeCode / 1000000000));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      lVar4 = lVar4 + 10000000000;
    }
  }
  return;
}

Assistant:

void Tracer::runTo(Time runToTime)
{
    auto state = fed->getCurrentMode();
    if (state == Federate::Modes::STARTUP) {
        initialize();
        state = Federate::Modes::INITIALIZING;
    }

    if (state == Federate::Modes::INITIALIZING) {
        fed->enterExecutingMode();
        captureForCurrentTime(0.0);
    }

    Time nextPrintTime = 10.0;
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;

            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }
            if (grantedTime >= runToTime) {
                break;
            }
            if (grantedTime >= nextPrintTime) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += 10.0;
            }
        }
    }
    catch (...) {
    }
}